

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O0

linfdef * linfini(mcmcxdef *mctx,errcxdef *ec,char *filename,int flen,tokpdef *path,
                 int must_find_file,int new_line_records)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  linfdef *plVar5;
  int in_ECX;
  char *in_RDX;
  undefined8 *in_R8;
  int in_R9D;
  char last;
  int len;
  tokpdef fakepath;
  char fbuf [4097];
  osfildef *fp;
  linfdef *linf;
  objnum *objp;
  int i;
  int in_stack_ffffffffffffef8c;
  undefined4 in_stack_ffffffffffffef90;
  size_t in_stack_ffffffffffffef98;
  undefined4 in_stack_ffffffffffffefa0;
  undefined4 in_stack_ffffffffffffefa4;
  char in_stack_ffffffffffffefa8;
  undefined7 in_stack_ffffffffffffefa9;
  mcmcxdef *in_stack_ffffffffffffefb0;
  char *in_stack_ffffffffffffefb8;
  int in_stack_ffffffffffffefc4;
  char *in_stack_ffffffffffffefc8;
  FILE *local_50;
  mcmon *local_40;
  int local_38;
  undefined8 *local_30;
  
  local_30 = in_R8;
  if (in_R8 == (undefined8 *)0x0) {
    local_30 = (undefined8 *)&stack0xffffffffffffef98;
    in_stack_ffffffffffffef98 = 0;
    in_stack_ffffffffffffefa0 = 0;
  }
  for (; local_30 != (undefined8 *)0x0; local_30 = (undefined8 *)*local_30) {
    iVar2 = *(int *)(local_30 + 1);
    if (iVar2 != 0) {
      memcpy(&stack0xffffffffffffefa8,(void *)((long)local_30 + 0xc),(long)iVar2);
      cVar1 = (&stack0xffffffffffffefa8)[iVar2 + -1];
      in_stack_ffffffffffffef90 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffef90);
      if ((cVar1 != '/') && (pcVar3 = strchr("",(int)cVar1), pcVar3 == (char *)0x0)) {
        (&stack0xffffffffffffefa8)[iVar2] = 0x2f;
        iVar2 = iVar2 + 1;
      }
    }
    memcpy(&stack0xffffffffffffefa8 + iVar2,in_RDX,(long)in_ECX);
    (&stack0xffffffffffffefa8)[iVar2 + in_ECX] = 0;
    local_50 = fopen(&stack0xffffffffffffefa8,"r");
    if (local_50 != (FILE *)0x0) break;
  }
  if ((local_50 == (FILE *)0x0) &&
     ((iVar2 = os_locate(in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc4,
                         in_stack_ffffffffffffefb8,(char *)in_stack_ffffffffffffefb0,
                         CONCAT71(in_stack_ffffffffffffefa9,in_stack_ffffffffffffefa8)), iVar2 == 0
      || (local_50 = fopen(&stack0xffffffffffffefa8,"r"), local_50 == (FILE *)0x0)))) {
    iVar2 = dbgu_find_src(in_RDX,in_ECX,&stack0xffffffffffffefa8,0x1001,in_R9D);
    if (iVar2 == 0) {
      return (linfdef *)0x0;
    }
    if (in_stack_ffffffffffffefa8 == '\0') {
      local_50 = (FILE *)0x0;
    }
    else {
      local_50 = fopen(&stack0xffffffffffffefa8,"r");
    }
    if ((local_50 == (FILE *)0x0) && (in_R9D != 0)) {
      return (linfdef *)0x0;
    }
  }
  if (local_50 == (FILE *)0x0) {
    in_stack_ffffffffffffefa8 = '\0';
    iVar2 = 0x1001;
  }
  else {
    sVar4 = strlen(&stack0xffffffffffffefa8);
    iVar2 = (int)sVar4;
  }
  plVar5 = (linfdef *)
           mchalo((errcxdef *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
                  in_stack_ffffffffffffef98,(char *)CONCAT44(iVar2,in_stack_ffffffffffffef90));
  linfini2(in_stack_ffffffffffffefb0,
           (linfdef *)CONCAT71(in_stack_ffffffffffffefa9,in_stack_ffffffffffffefa8),
           (char *)CONCAT44(in_stack_ffffffffffffefa4,in_stack_ffffffffffffefa0),
           (int)(in_stack_ffffffffffffef98 >> 0x20),
           (osfildef *)CONCAT44(iVar2,in_stack_ffffffffffffef90),in_stack_ffffffffffffef8c);
  memcpy(plVar5->linfnam + (long)in_ECX + 1,&stack0xffffffffffffefa8,(long)iVar2);
  plVar5->linfnam[in_ECX + 1 + iVar2] = '\0';
  local_40 = plVar5->linfpg;
  for (local_38 = 0x80; local_38 != 0; local_38 = local_38 + -1) {
    *local_40 = 0xffff;
    local_40 = local_40 + 1;
  }
  return plVar5;
}

Assistant:

linfdef *linfini(mcmcxdef *mctx, errcxdef *ec, char *filename,
                 int flen, tokpdef *path, int must_find_file,
                 int new_line_records)
{
    int       i;
    objnum   *objp;
    linfdef  *linf;
    osfildef *fp;
    char      fbuf[OSFNMAX + 1];
    tokpdef   fakepath;
    int       len;
    
    if (!path)
    {
        path = &fakepath;
        fakepath.tokpnxt = (tokpdef *)0;
        fakepath.tokplen = 0;
    }

    /* search through the path list */
    for ( ; path ; path = path->tokpnxt)
    {
        char last;

        /* prefix the current path */
        if ((len = path->tokplen) != 0)
        {
            memcpy(fbuf, path->tokpdir, (size_t)len);
            last = fbuf[len - 1];
            if (last == OSPATHCHAR ||
                (OSPATHALT && strchr(OSPATHALT, last)))
                /* do nothing */ ;
            else
            {
                /* append path separator character */
                fbuf[len++] = OSPATHCHAR;
            }
        }

        /* add the filename and null-terminate */
        memcpy(fbuf + len, filename, (size_t)flen);
        fbuf[len + flen] = '\0';
        
        /* attempt to open this file */
        if ((fp = osfoprs(fbuf, OSFTTEXT)) != 0)
            break;
    }

    /* 
     *   If no file opened yet, search tads path; if that doesn't work,
     *   let the debugger UI try to find the file.  If nothing works, give
     *   up and return failure.  
     */
    if (fp == 0
        && (!os_locate(filename, flen, (char *)0, fbuf, sizeof(fbuf))
            || (fp = osfoprs(fbuf, OSFTTEXT)) == 0))
    {
        /*
         *   Ask the debugger UI for advice.  If the debugger isn't
         *   present, we'll get a failure code from this routine. 
         */
        if (!dbgu_find_src(filename, flen, fbuf, sizeof(fbuf),
                           must_find_file))
            return 0;

        /* try opening the file */
        if (fbuf[0] == '\0')
        {
            /* 
             *   we didn't get a filename - the UI wants to defer finding
             *   the file until later 
             */
            fp = 0;
        }
        else
        {
            /* we got a filename from the UI - try opening it */
            fp = osfoprs(fbuf, OSFTTEXT);
        }

        /* 
         *   if the file isn't present, and we're required to find it,
         *   return failure 
         */
        if (fp == 0 && must_find_file)
            return 0;
    }
    
    /* figure out how much space we need for the file's full name */
    if (fp == 0)
    {
        /* 
         *   we didn't find the file, so we don't yet know its name - use
         *   the maximum possible filename length for the buffer size, so
         *   that we can store the final filename if we should figure out
         *   where the file is later on 
         */
        fbuf[0] = '\0';
        len = sizeof(fbuf);
    }
    else
    {
        /* 
         *   we found the file, so we have its final name - allocate space
         *   for the known name 
         */
        len = (int)strlen(fbuf);
    }

    /* allocate the linfdef */
    linf = (linfdef *)mchalo(ec, (ushort)(sizeof(linfdef) + flen
                                          + len + 1), "linfini");

    /* do the basic initialization */
    linfini2(mctx, linf, filename, flen, fp, new_line_records);

    memcpy(linf->linfnam + flen + 1, fbuf, (size_t)len);
    linf->linfnam[flen + 1 + len] = '\0';
    
    /* set all debugger pages to not-yet-allocated */
    for (i = LINFPGMAX, objp = linf->linfpg ; i ; ++objp, --i)
        *objp = MCMONINV;

    /* return the new line source object */
    return linf;
}